

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O1

void __thiscall M7Getter::~M7Getter(M7Getter *this)

{
  pointer pp_Var1;
  ulong uVar2;
  
  pp_Var1 = (this->algo_count).
            super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->algo_count).
      super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>._M_impl.
      super__Vector_impl_data._M_finish != pp_Var1) {
    uVar2 = 0;
    do {
      if (pp_Var1[uVar2] != (_st_m7_algo_count_t *)0x0) {
        operator_delete(pp_Var1[uVar2]);
        (this->algo_count).
        super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] = (_st_m7_algo_count_t *)0x0;
      }
      uVar2 = uVar2 + 1;
      pp_Var1 = (this->algo_count).
                super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->algo_count).
                                   super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3))
    ;
  }
  if (pp_Var1 != (pointer)0x0) {
    operator_delete(pp_Var1);
    return;
  }
  return;
}

Assistant:

M7Getter::~M7Getter()
{
    for (size_t i = 0; i < algo_count.size(); i++)
    {
        if (algo_count[i] != NULL)
        {
            delete algo_count[i];
            algo_count[i] = NULL;
        }
    }
}